

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

int __thiscall testing::UnitTest::test_suite_to_run_count(UnitTest *this)

{
  int iVar1;
  
  iVar1 = internal::UnitTestImpl::test_suite_to_run_count(this->impl_);
  return iVar1;
}

Assistant:

const internal::UnitTestImpl* impl() const { return impl_; }